

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrcmap.c
# Opt level: O0

FT_Error pfr_cmap_init(PFR_CMap cmap,FT_Pointer pointer)

{
  FT_Face pFVar1;
  uint local_2c;
  FT_UInt n;
  PFR_Face face;
  FT_Error error;
  FT_Pointer pointer_local;
  PFR_CMap cmap_local;
  
  pFVar1 = (cmap->cmap).charmap.face;
  cmap->num_chars = *(FT_UInt *)&pFVar1[2].generic.data;
  cmap->chars = (PFR_Char)pFVar1[2].bbox.xMin;
  local_2c = 1;
  while( true ) {
    if (cmap->num_chars <= local_2c) {
      return 0;
    }
    if (cmap->chars[local_2c].char_code <= cmap->chars[local_2c - 1].char_code) break;
    local_2c = local_2c + 1;
  }
  return 8;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  pfr_cmap_init( PFR_CMap    cmap,
                 FT_Pointer  pointer )
  {
    FT_Error  error = FT_Err_Ok;
    PFR_Face  face  = (PFR_Face)FT_CMAP_FACE( cmap );

    FT_UNUSED( pointer );


    cmap->num_chars = face->phy_font.num_chars;
    cmap->chars     = face->phy_font.chars;

    /* just for safety, check that the character entries are correctly */
    /* sorted in increasing character code order                       */
    {
      FT_UInt  n;


      for ( n = 1; n < cmap->num_chars; n++ )
      {
        if ( cmap->chars[n - 1].char_code >= cmap->chars[n].char_code )
        {
          error = FT_THROW( Invalid_Table );
          goto Exit;
        }
      }
    }

  Exit:
    return error;
  }